

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.h
# Opt level: O2

void __thiscall
RayTracerTriangles::RayTracerTriangles(RayTracerTriangles *this,RayTracerConfig *config)

{
  vector<Triangle,_std::allocator<Triangle>_> *triangles;
  int iVar1;
  ostream *poVar2;
  KdNode *pKVar3;
  Triangle *triangle;
  pointer tr;
  pointer pTVar4;
  float fVar5;
  Point PVar6;
  Point PVar7;
  float local_68;
  float fStack_64;
  undefined1 auStack_48 [8];
  vector<float,_std::allocator<float>_> ranges;
  
  RayTracerBase::RayTracerBase(&this->super_RayTracerBase,config);
  iVar1 = std::thread::hardware_concurrency();
  this->threadNumber = iVar1;
  this->kdTree = (KdNode *)0x0;
  poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,iVar1);
  std::operator<<(poVar2," threads available\n");
  auStack_48 = (undefined1  [8])0x0;
  ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  triangles = &config->triangles;
  tr = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
       super__Vector_impl_data._M_start;
  pTVar4 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar4 != tr) {
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_48,(value_type_conflict *)tr);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_48,
               (value_type_conflict *)
               (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
               super__Vector_impl_data._M_start);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_48,
               &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                  super__Vector_impl_data._M_start)->x).y);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_48,
               &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                  super__Vector_impl_data._M_start)->x).y);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_48,
               &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                  super__Vector_impl_data._M_start)->x).z);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_48,
               &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                  super__Vector_impl_data._M_start)->x).z);
    tr = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
         super__Vector_impl_data._M_start;
    pTVar4 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; tr != pTVar4; tr = tr + 1) {
    PVar6 = getMinPoint(tr);
    PVar7 = getMaxPoint(tr);
    local_68 = PVar6.x;
    fStack_64 = PVar6.y;
    if (*(float *)auStack_48 <= local_68) {
      local_68 = *(float *)auStack_48;
    }
    *(float *)auStack_48 = local_68;
    fVar5 = PVar7.x;
    if (PVar7.x <= *(float *)((long)auStack_48 + 4)) {
      fVar5 = *(float *)((long)auStack_48 + 4);
    }
    *(float *)((long)auStack_48 + 4) = fVar5;
    if (*(float *)((long)auStack_48 + 8) <= fStack_64) {
      fStack_64 = *(float *)((long)auStack_48 + 8);
    }
    *(float *)((long)auStack_48 + 8) = fStack_64;
    fVar5 = PVar7.y;
    if (PVar7.y <= *(float *)((long)auStack_48 + 0xc)) {
      fVar5 = *(float *)((long)auStack_48 + 0xc);
    }
    *(float *)((long)auStack_48 + 0xc) = fVar5;
    fVar5 = PVar6.z;
    if (*(float *)((long)auStack_48 + 0x10) <= PVar6.z) {
      fVar5 = *(float *)((long)auStack_48 + 0x10);
    }
    *(float *)((long)auStack_48 + 0x10) = fVar5;
    fVar5 = PVar7.z;
    if (PVar7.z <= *(float *)((long)auStack_48 + 0x14)) {
      fVar5 = *(float *)((long)auStack_48 + 0x14);
    }
    *(float *)((long)auStack_48 + 0x14) = fVar5;
  }
  pKVar3 = KdNode::build(triangles,(vector<float,_std::allocator<float>_> *)auStack_48,0);
  this->kdTree = pKVar3;
  poVar2 = std::operator<<((ostream *)&std::cerr,"building complete");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)auStack_48);
  return;
}

Assistant:

RayTracerTriangles(RayTracerConfig const& config)
    : RayTracerBase(config)
    , threadNumber(std::thread::hardware_concurrency())
  {
    std::cerr << threadNumber << " threads available\n";
    std::vector<float> ranges;
    if(config.triangles.size() > 0)
    {
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.z);
      ranges.push_back(config.triangles[0].x.z);
    }
    for(auto const& triangle : config.triangles)
    {
      Point pMin = getMinPoint(triangle);
      Point pMax = getMaxPoint(triangle);

       ranges[0] = std::min(ranges[0], pMin.x); 
       ranges[1] = std::max(ranges[1], pMax.x); 
       ranges[2] = std::min(ranges[2], pMin.y); 
       ranges[3] = std::max(ranges[3], pMax.y); 
       ranges[4] = std::min(ranges[4], pMin.z); 
       ranges[5] = std::max(ranges[5], pMax.z); 
    }
    kdTree = KdNode::build(const_cast<RayTracerConfig&>(config).triangles, ranges, 0);
    std::cerr << "building complete" << std::endl;
  }